

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O1

void flatcc_emitter_reset(flatcc_emitter_t *E)

{
  flatcc_emitter_page_t *pfVar1;
  flatcc_emitter_page_t *__ptr;
  size_t sVar2;
  ulong uVar3;
  
  pfVar1 = E->front;
  if (pfVar1 != (flatcc_emitter_page_t *)0x0) {
    E->back = pfVar1;
    E->front_cursor = pfVar1->page + 0x5c0;
    E->back_cursor = pfVar1->page + 0x5c0;
    E->front_left = 0x5c0;
    E->back_left = 0x5c0;
    pfVar1->page_offset = -0x5c0;
    if (E->used_average == 0) {
      E->used_average = E->used;
    }
    sVar2 = (E->used >> 2) + (E->used_average * 3 >> 2);
    E->used_average = sVar2;
    E->used = 0;
    if (sVar2 * 2 < E->capacity) {
      do {
        pfVar1 = E->back;
        __ptr = pfVar1->next;
        if (__ptr == E->front) {
          return;
        }
        pfVar1->next = __ptr->next;
        __ptr->next->prev = pfVar1;
        free(__ptr);
        uVar3 = E->capacity - 0xb80;
        E->capacity = uVar3;
      } while (E->used_average * 2 < uVar3);
    }
  }
  return;
}

Assistant:

void flatcc_emitter_reset(flatcc_emitter_t *E)
{
    flatcc_emitter_page_t *p = E->front;

    if (!E->front) {
        return;
    }
    E->back = E->front;
    E->front_cursor = E->front->page + FLATCC_EMITTER_PAGE_SIZE / 2;
    E->back_cursor = E->front_cursor;
    E->front_left = FLATCC_EMITTER_PAGE_SIZE / 2;
    E->back_left = FLATCC_EMITTER_PAGE_SIZE - FLATCC_EMITTER_PAGE_SIZE / 2;
    E->front->page_offset = -(flatbuffers_soffset_t)E->front_left;
    /* Heuristic to reduce peak allocation over time. */
    if (E->used_average == 0) {
        E->used_average = E->used;
    }
    E->used_average = E->used_average * 3 / 4 + E->used / 4;
    E->used = 0;
    while (E->used_average * 2 < E->capacity && E->back->next != E->front) {
        /* We deallocate the page after back since it is less likely to be hot in cache. */
        p = E->back->next;
        E->back->next = p->next;
        p->next->prev = E->back;
        FLATCC_EMITTER_FREE(p);
        E->capacity -= FLATCC_EMITTER_PAGE_SIZE;
    }
}